

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::emit_texture_load_instruction(Impl *impl,CallInst *instruction)

{
  uint32_t uVar1;
  uint uVar2;
  mapped_type *pmVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ComponentType element_type;
  Id IVar7;
  ValueKind VVar8;
  Op OVar9;
  Id IVar10;
  Builder *pBVar11;
  Value *pVVar12;
  mapped_type *pmVar13;
  Operation *pOVar14;
  Type *pTVar15;
  Op op;
  ulong uVar16;
  ulong uVar17;
  uint32_t image_ops;
  Id image_id;
  uint num_coords;
  Id coord [3];
  Id offsets [4];
  uint num_coords_full;
  undefined1 in_stack_ffffffffffffff38;
  uint32_t local_b8;
  uint local_b4;
  Id local_b0;
  Id local_ac;
  ulong local_a8;
  Operation *local_a0;
  uint local_98;
  uint32_t local_94;
  mapped_type *local_90;
  Id local_88 [4];
  Id local_78 [7];
  uint32_t local_5c;
  Vector<spv::Id> local_58;
  Id local_38;
  Id local_34;
  
  bVar4 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  bVar5 = true;
  if (bVar4) {
    pBVar11 = Converter::Impl::builder(impl);
    pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    local_ac = Converter::Impl::get_id_for_value(impl,pVVar12,0);
    IVar7 = Converter::Impl::get_type_id(impl,local_ac);
    local_90 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->handle_to_resource_meta,&local_ac);
    bVar4 = spv::Builder::isStorageImageType(pBVar11,IVar7);
    local_b8 = 0;
    pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    pVVar12 = LLVMBC::Internal::resolve_proxy(pVVar12);
    VVar8 = LLVMBC::Value::get_value_kind(pVVar12);
    local_b0 = 0;
    if (VVar8 != Undef) {
      pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
      local_b0 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
      bVar5 = spv::Builder::isMultisampledImageType(pBVar11,IVar7);
      if (bVar5) {
        local_b8 = 0x40;
      }
      else {
        local_b8 = 2;
      }
    }
    local_88[2] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_5c = 0;
    local_94 = 0;
    bVar6 = get_image_dimensions(impl,local_ac,&local_5c,&local_94);
    uVar1 = local_5c;
    bVar5 = local_5c < 4 && bVar6;
    if (local_5c < 4 && bVar6) {
      uVar17 = (ulong)local_5c;
      if (uVar17 != 0) {
        uVar16 = 0;
        do {
          pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar16 + 3)
          ;
          IVar7 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
          local_88[uVar16] = IVar7;
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      local_78[0] = 0;
      local_78[1] = 0;
      local_78[2] = 0;
      local_78[3] = 0;
      local_a8 = (ulong)local_94;
      get_texel_offsets(impl,instruction,&local_b8,6,local_94,local_78,
                        (bool)in_stack_ffffffffffffff38);
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)instruction;
      pmVar13 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_composite_meta,(key_type *)&local_58);
      local_b4 = pmVar13->access_mask;
      if ((local_b4 & 0x10) != 0) {
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_58.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar11->capabilities,(Capability *)&local_58);
      }
      element_type = Converter::Impl::get_effective_typed_resource_type(local_90->component_type);
      IVar7 = Converter::Impl::get_type_id(impl,element_type,1,4,false);
      if ((local_b4 & 0x10) == 0) {
        OVar9 = OpImageRead;
        op = OpImageFetch;
      }
      else {
        IVar10 = spv::Builder::makeIntegerType(pBVar11,0x20,false);
        local_a0 = (Operation *)CONCAT44(local_a0._4_4_,IVar10);
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             &(((CallInst *)
               local_58.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
        *(undefined4 *)
         &(((CallInst *)
           local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type =
             local_a0._0_4_;
        *(Id *)((long)&(((CallInst *)
                        local_58.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.
                       type + 4) = IVar7;
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        IVar7 = Converter::Impl::get_struct_type(impl,&local_58,0,"SparseTexel");
        if ((CallInst *)
            local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start != (CallInst *)0x0) {
          free_in_thread(local_58.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
        OVar9 = OpImageSparseRead;
        op = OpImageSparseFetch;
      }
      if (bVar4) {
        op = OVar9;
      }
      pOVar14 = Converter::Impl::allocate(impl,op,(Value *)instruction,IVar7);
      if ((local_b4 & 0x10) == 0) {
        pTVar15 = LLVMBC::Value::getType((Value *)instruction);
        pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar15,pOVar14->id,true);
      }
      local_a0 = pOVar14;
      IVar7 = spv::Builder::makeIntegerType(pBVar11,0x20,false);
      IVar7 = Converter::Impl::build_vector(impl,IVar7,local_88,uVar1);
      if ((!bVar4) && ((local_b8 & 0x10) != 0)) {
        local_98 = local_b8;
        uVar16 = local_a8;
        if ((uint)local_a8 < uVar1) {
          do {
            IVar10 = spv::Builder::makeIntegerType(pBVar11,0x20,true);
            IVar10 = spv::Builder::makeIntConstant(pBVar11,IVar10,0,false);
            local_78[uVar16] = IVar10;
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
        IVar10 = spv::Builder::makeIntegerType(pBVar11,0x20,true);
        IVar10 = Converter::Impl::build_vector_type(impl,IVar10,uVar1);
        pOVar14 = Converter::Impl::allocate(impl,OpIAdd,IVar10);
        Operation::add_id(pOVar14,IVar7);
        uVar2 = local_98;
        IVar7 = build_texel_offset_vector(impl,local_78,uVar1,local_98,false);
        Operation::add_id(pOVar14,IVar7);
        Converter::Impl::add(impl,pOVar14,false);
        IVar7 = pOVar14->id;
        local_b8 = uVar2 & 0xffffffef;
      }
      pOVar14 = local_a0;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = &local_38;
      local_38 = local_ac;
      local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      local_34 = IVar7;
      Operation::add_ids(local_a0,(initializer_list<unsigned_int> *)&local_58);
      uVar1 = local_b8;
      Operation::add_literal(pOVar14,local_b8);
      if (!bVar4) {
        if ((uVar1 & 2) != 0) {
          Operation::add_id(pOVar14,local_b0);
        }
        if ((uVar1 & 8) != 0) {
          IVar7 = build_texel_offset_vector(impl,local_78,(uint)local_a8,uVar1,false);
          Operation::add_id(pOVar14,IVar7);
        }
      }
      if (((uVar1 & 0x40) != 0) && (Operation::add_id(pOVar14,local_b0), bVar4)) {
        pBVar11 = Converter::Impl::builder(impl);
        local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_58.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1b);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar11->capabilities,(Capability *)&local_58);
      }
      pmVar3 = local_90;
      Converter::Impl::add(impl,pOVar14,local_90->rov);
      pTVar15 = LLVMBC::Value::getType((Value *)instruction);
      pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
      if ((local_b4 & 0x10) == 0) {
        Converter::Impl::fixup_load_type_typed
                  (impl,pmVar3->component_type,4,(Value *)instruction,pTVar15);
        build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
      }
      else {
        Converter::Impl::repack_sparse_feedback
                  (impl,pmVar3->component_type,4,(Value *)instruction,pTVar15,0);
      }
    }
  }
  return bVar5;
}

Assistant:

bool emit_texture_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	bool is_uav = builder.isStorageImageType(image_type_id);
	uint32_t image_ops = 0;

	spv::Id mip_or_sample = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(2)))
	{
		mip_or_sample = impl.get_id_for_value(instruction->getOperand(2));
		if (builder.isMultisampledImageType(image_type_id))
			image_ops |= spv::ImageOperandsSampleMask;
		else
			image_ops |= spv::ImageOperandsLodMask;
	}

	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[4] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 6, num_coords, offsets, false))
		return false;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Op opcode;
	if (is_uav)
		opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
	else
		opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	spv::Id coord_id = impl.build_vector(builder.makeUintType(32), coord, num_coords_full);
	if (!is_uav && (image_ops & spv::ImageOperandsOffsetMask))
	{
		// Don't need fancy features for fetch, just do arith.
		for (unsigned i = num_coords; i < num_coords_full; i++)
			offsets[i] = builder.makeIntConstant(0);
		auto *add_op = impl.allocate(spv::OpIAdd, impl.build_vector_type(builder.makeIntType(32), num_coords_full));
		add_op->add_id(coord_id);
		add_op->add_id(build_texel_offset_vector(impl, offsets, num_coords_full, image_ops, false));
		impl.add(add_op);
		coord_id = add_op->id;
		image_ops &= ~spv::ImageOperandsOffsetMask;
	}

	op->add_ids({ image_id, coord_id });
	op->add_literal(image_ops);

	if (!is_uav)
	{
		if (image_ops & spv::ImageOperandsLodMask)
			op->add_id(mip_or_sample);

		if (image_ops & spv::ImageOperandsConstOffsetMask)
			op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));
	}

	if (image_ops & spv::ImageOperandsSampleMask)
	{
		op->add_id(mip_or_sample);
		if (is_uav)
			impl.builder().addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}